

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool EV_RotatePoly(line_t_conflict *line,int polyNum,int speed,int byteAngle,int direction,
                  bool overRide)

{
  FPolyObj *poly;
  DPolyAction *pDVar1;
  bool bVar2;
  double dVar3;
  FPolyMirrorIterator it;
  
  it.CurPoly = PO_GetPolyobj(polyNum);
  if (it.CurPoly == (FPolyObj *)0x0) {
    bVar2 = false;
    Printf("EV_RotatePoly: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
  }
  else {
    it.UsedPolys[0] = (it.CurPoly)->tag;
    it.NumUsedPolys = 1;
    bVar2 = false;
    while (poly = FPolyMirrorIterator::NextMirror(&it), poly != (FPolyObj *)0x0) {
      pDVar1 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&poly->specialdata);
      if (pDVar1 == (DPolyAction *)0x0) {
        if (poly->bBlocked == true && !overRide) {
          return bVar2;
        }
      }
      else if (!overRide) {
        return bVar2;
      }
      if (poly->bHasPortals == '\x02') {
        return bVar2;
      }
      pDVar1 = (DPolyAction *)DObject::operator_new(0x58);
      DRotatePoly::DRotatePoly((DRotatePoly *)pDVar1,poly->tag);
      (poly->specialdata).field_0.p = pDVar1;
      poly->bBlocked = false;
      if (byteAngle == 0) {
        dVar3 = 360.0;
      }
      else {
        dVar3 = -1.0;
        if (byteAngle != 0xff) {
          dVar3 = (double)byteAngle * 1.40625;
        }
      }
      pDVar1->m_Dist = dVar3;
      pDVar1->m_Speed = (double)(direction * speed) * 0.17578125;
      SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
      direction = -direction;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool EV_RotatePoly (line_t *line, int polyNum, int speed, int byteAngle,
					int direction, bool overRide)
{
	DRotatePoly *pe = NULL;
	FPolyObj *poly;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_RotatePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		if (poly->bHasPortals == 2)
		{
			// cannot do rotations on linked polyportals.
			break;
		}
		pe = new DRotatePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		if (byteAngle != 0)
		{
			if (byteAngle == 255)
			{
				pe->m_Dist = -1.;
			}
			else
			{
				pe->m_Dist =  byteAngle*(90./64); // Angle
			}
		}
		else
		{
			pe->m_Dist = 360.;
		}
		pe->m_Speed = speed*direction*(90./(64<<3));
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
		direction = -direction;	// Reverse the direction
	}
	return pe != NULL;	// Return true if something started moving.
}